

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::to_string_abi_cxx11_(string *__return_storage_ptr__,tinyusdz *this,Axis v)

{
  allocator local_18;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  int local_14;
  string *psStack_10;
  Axis v_local;
  
  local_14 = (int)this;
  psStack_10 = __return_storage_ptr__;
  if (local_14 == 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"X",&local_15);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_15);
  }
  else if (local_14 == 1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"Y",&local_16);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_16);
  }
  else if (local_14 == 2) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"Z",&local_17);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_17);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)__return_storage_ptr__,"[[InvalidAxis]]",&local_18);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_18);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(tinyusdz::Axis v) {
  if (v == tinyusdz::Axis::X) {
    return "X";
  } else if (v == tinyusdz::Axis::Y) {
    return "Y";
  } else if (v == tinyusdz::Axis::Z) {
    return "Z";
  } else {
    return "[[InvalidAxis]]";
  }
}